

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::NonMaximumSuppression::Clear(NonMaximumSuppression *this)

{
  string *psVar1;
  
  psVar1 = (this->confidenceinputfeaturename_).ptr_;
  if (psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  psVar1 = (this->coordinatesinputfeaturename_).ptr_;
  if (psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  psVar1 = (this->iouthresholdinputfeaturename_).ptr_;
  if (psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  psVar1 = (this->confidencethresholdinputfeaturename_).ptr_;
  if (psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  psVar1 = (this->confidenceoutputfeaturename_).ptr_;
  if (psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  psVar1 = (this->coordinatesoutputfeaturename_).ptr_;
  if (psVar1 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  this->iouthreshold_ = 0.0;
  this->confidencethreshold_ = 0.0;
  if ((this->_oneof_case_[0] == 1) &&
     ((this->SuppressionMethod_).picktop_ != (NonMaximumSuppression_PickTop *)0x0)) {
    (*(((this->SuppressionMethod_).picktop_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->_oneof_case_[0] = 0;
  clear_ClassLabels(this);
  return;
}

Assistant:

void NonMaximumSuppression::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.NonMaximumSuppression)
  confidenceinputfeaturename_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  coordinatesinputfeaturename_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  iouthresholdinputfeaturename_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  confidencethresholdinputfeaturename_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  confidenceoutputfeaturename_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  coordinatesoutputfeaturename_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  ::memset(&iouthreshold_, 0, reinterpret_cast<char*>(&confidencethreshold_) -
    reinterpret_cast<char*>(&iouthreshold_) + sizeof(confidencethreshold_));
  clear_SuppressionMethod();
  clear_ClassLabels();
}